

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O2

int __thiscall MeCab::Connector::open(Connector *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  ushort uVar2;
  Mmap<short> *pMVar3;
  ushort *puVar4;
  ulong uVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  wlog wStack_18;
  
  iVar6 = Mmap<short>::open((this->cmmap_).ptr_,__file,__oflag);
  if ((char)iVar6 == '\0') {
    wlog::wlog(&wStack_18,&this->what_);
    poVar7 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x18);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"cmmap_->open(filename, mode)");
    poVar7 = std::operator<<(poVar7,"] ");
    pcVar8 = "cannot open: ";
  }
  else {
    pMVar3 = (this->cmmap_).ptr_;
    puVar4 = (ushort *)pMVar3->text;
    this->matrix_ = (short *)puVar4;
    if (puVar4 == (ushort *)0x0) {
      wlog::wlog(&wStack_18,&this->what_);
      poVar7 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1d);
      poVar7 = std::operator<<(poVar7,") [");
      poVar7 = std::operator<<(poVar7,"matrix_");
      poVar7 = std::operator<<(poVar7,"] ");
      __file = "matrix is NULL";
      goto LAB_0015f897;
    }
    uVar5 = pMVar3->length;
    if (uVar5 < 4) {
      wlog::wlog(&wStack_18,&this->what_);
      poVar7 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1e);
      poVar7 = std::operator<<(poVar7,") [");
      pcVar8 = "cmmap_->size() >= 2";
    }
    else {
      uVar1 = *puVar4;
      this->lsize_ = uVar1;
      uVar2 = puVar4[1];
      this->rsize_ = uVar2;
      if ((ulong)uVar2 * (ulong)uVar1 + 2 == uVar5 >> 1) {
        this->matrix_ = (short *)(puVar4 + 2);
        return (int)CONCAT71((int7)((ulong)(puVar4 + 2) >> 8),1);
      }
      wlog::wlog(&wStack_18,&this->what_);
      poVar7 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x25);
      poVar7 = std::operator<<(poVar7,") [");
      pcVar8 = "static_cast<size_t>(lsize_ * rsize_ + 2) == cmmap_->size()";
    }
    poVar7 = std::operator<<(poVar7,pcVar8);
    poVar7 = std::operator<<(poVar7,"] ");
    pcVar8 = "file size is invalid: ";
  }
  poVar7 = std::operator<<(poVar7,pcVar8);
LAB_0015f897:
  std::operator<<(poVar7,__file);
  return 0;
}

Assistant:

bool Connector::open(const char* filename,
                     const char *mode) {
  CHECK_FALSE(cmmap_->open(filename, mode))
      << "cannot open: " << filename;

  matrix_ = cmmap_->begin();

  CHECK_FALSE(matrix_) << "matrix is NULL" ;
  CHECK_FALSE(cmmap_->size() >= 2)
      << "file size is invalid: " << filename;

  lsize_ = static_cast<unsigned short>((*cmmap_)[0]);
  rsize_ = static_cast<unsigned short>((*cmmap_)[1]);

  CHECK_FALSE(static_cast<size_t>(lsize_ * rsize_ + 2)
                    == cmmap_->size())
      << "file size is invalid: " << filename;

  matrix_ = cmmap_->begin() + 2;
  return true;
}